

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlMarshall.c
# Opt level: O1

JL_STATUS JlMarshallFromStructToDataObject
                    (void *Structure,JlMarshallElement *StructDescription,
                    size_t StructDescriptionCount,JlDataObject *DictionaryObject)

{
  JL_DATA_TYPE JVar1;
  JL_STATUS JVar2;
  
  JVar2 = JL_STATUS_INVALID_PARAMETER;
  if ((((Structure != (void *)0x0) && (StructDescriptionCount != 0)) &&
      (StructDescription != (JlMarshallElement *)0x0)) && (DictionaryObject != (JlDataObject *)0x0))
  {
    JVar1 = JlGetObjectType(DictionaryObject);
    JVar2 = JL_STATUS_WRONG_TYPE;
    if (JVar1 == JL_DATA_TYPE_DICTIONARY) {
      JVar2 = MarshallDictionary(Structure,StructDescription,StructDescriptionCount,DictionaryObject
                                );
      return JVar2;
    }
  }
  return JVar2;
}

Assistant:

JL_STATUS
    JlMarshallFromStructToDataObject
    (
        void const*                 Structure,
        JlMarshallElement const*    StructDescription,
        size_t                      StructDescriptionCount,
        JlDataObject*               DictionaryObject
    )
{
    JL_STATUS jlStatus;

    if(     NULL != DictionaryObject
        &&  NULL != StructDescription
        &&  0 != StructDescriptionCount
        &&  NULL != Structure )
    {
        if( JL_DATA_TYPE_DICTIONARY == JlGetObjectType( DictionaryObject ) )
        {
            jlStatus = MarshallDictionary( Structure, StructDescription, StructDescriptionCount, DictionaryObject );
        }
        else
        {
            // Root object must be a dictionary
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}